

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::BlindPermuteProgram(Alice *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  Server *this_00;
  long lVar4;
  ostream *poVar5;
  undefined1 auVar6 [8];
  long lVar7;
  int j;
  long lVar8;
  int j_1;
  long lVar9;
  vector<Instruction,_std::allocator<Instruction>_> local_80;
  long local_68;
  vector<Instruction,_std::allocator<Instruction>_> local_60;
  undefined1 local_48 [8];
  vector<Instruction,_std::allocator<Instruction>_> V;
  
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_48,
             (long)(this->super_Party).n_p,(allocator_type *)&local_60);
  lVar4 = (long)(this->super_Party).n_p;
  if (0 < lVar4) {
    pvVar1 = (this->super_Party).P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->super_Party).R_P.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    auVar6 = local_48;
    do {
      lVar9 = *(long *)&pvVar1[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar3 = *(long *)&pvVar2[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        ((pointer)auVar6)->val[lVar8] = *(long *)(lVar3 + lVar8 * 8) + *(long *)(lVar9 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      lVar7 = lVar7 + 1;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x28);
    } while (lVar7 != lVar4);
  }
  this_00 = this->srv;
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            (&local_80,(vector<Instruction,_std::allocator<Instruction>_> *)local_48);
  Server::SendProgramVector(this_00,&local_80,(this->super_Party).n_p);
  if (local_80.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Server::ReceiveProgramVector(&local_60,this->srv);
  std::vector<Instruction,_std::allocator<Instruction>_>::operator=
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_48,&local_60);
  if (local_60.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Alice\'s Permuted Program P_A:\n",0x1e);
  if (0 < (this->super_Party).n_p) {
    lVar7 = 0;
    lVar4 = 0;
    do {
      lVar9 = 0;
      local_68 = lVar4;
      do {
        *(long *)(*(long *)&(this->super_Party).P.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data + lVar9 * 8) =
             *(long *)(*(long *)&(this->Pi_P_diff_R_PB_R_PA).
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data + lVar9 * 8) +
             *(long *)((long)(long *)local_48 + lVar9 * 8 + lVar7);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      lVar4 = local_68 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar4 < (this->super_Party).n_p);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,
                    (long)V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_48);
  }
  return;
}

Assistant:

void Alice::BlindPermuteProgram()
{
    std::vector<Instruction> V(n_p);
    for(int i=0; i<n_p; i++)
        for(int j=0; j<5; j++)
            V[i].val[j] = P[i][j] + R_P[i][j];
    srv->SendProgramVector(V, n_p);
    V = srv->ReceiveProgramVector();
    std::cout<<"Alice's Permuted Program P_A:\n";
    for(int i=0; i<n_p; i++){
        for(int j=0; j<5; j++){
            P[i][j] = V[i].val[j] + Pi_P_diff_R_PB_R_PA[i][j];
            std::cout<<P[i][j]<<" ";
        }
        std::cout<<std::endl;
    }
}